

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autogenerated_settings.cpp
# Opt level: O2

void duckdb::PartitionedWriteMaxOpenFilesSetting::ResetLocal(ClientContext *context)

{
  ClientConfig *pCVar1;
  ClientConfig CStack_1f8;
  
  switchD_016d4fed::default(&CStack_1f8,0,0x1e8);
  ClientConfig::ClientConfig(&CStack_1f8);
  pCVar1 = ClientConfig::GetConfig(context);
  pCVar1->partitioned_write_max_open_files = CStack_1f8.partitioned_write_max_open_files;
  ClientConfig::~ClientConfig(&CStack_1f8);
  return;
}

Assistant:

void PartitionedWriteMaxOpenFilesSetting::ResetLocal(ClientContext &context) {
	ClientConfig::GetConfig(context).partitioned_write_max_open_files = ClientConfig().partitioned_write_max_open_files;
}